

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

pair<int,_int> __thiscall imrt::Station::getPos(Station *this,int index)

{
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  pair<int,_int> pVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  int local_2c;
  
  this_00 = &this->beam2pos;
  local_2c = index;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
          ::find(&this_00->_M_t,&local_2c);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->beam2pos)._M_t._M_impl.super__Rb_tree_header) {
    pVar3 = Collimator::indexToPos(this->collimator,local_2c,this->angle);
    pmVar4 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](this_00,&local_2c);
    iVar1 = local_2c;
    pmVar4->first = pVar3.first;
    pmVar4->second = pVar3.second;
    pmVar4 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](this_00,&local_2c);
    pmVar5 = std::
             map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::operator[](&this->pos2beam,pmVar4);
    *pmVar5 = iVar1;
    pmVar4 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](this_00,&local_2c);
  }
  else {
    pmVar4 = (mapped_type *)&iVar2._M_node[1].field_0x4;
  }
  pVar3.first = pmVar4->first;
  pVar3.second = pmVar4->second;
  return pVar3;
}

Assistant:

pair<int,int> Station::getPos(int index) const{
    auto pos = beam2pos.find(index);
    if(pos==beam2pos.end()){
      beam2pos[index]=collimator.indexToPos(index, angle);
      pos2beam[beam2pos[index]]=index;
      return beam2pos[index];
    }
    return(pos->second);
  }